

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O3

void __thiscall QTuioHandler::process2DObjSet(QTuioHandler *this,QOscMessage *message)

{
  QVariant *pQVar1;
  long lVar2;
  int iVar3;
  uint t;
  iterator iVar4;
  QDebug *pQVar5;
  QTuioToken *this_00;
  QTextStream *pQVar6;
  long in_FS_OFFSET;
  float t_00;
  float t_01;
  float t_02;
  float t_03;
  float t_04;
  float t_05;
  float t_06;
  float t_07;
  QByteArrayView QVar7;
  int id;
  QDebug local_80;
  QDebug local_78;
  QtPrivate local_70 [8];
  undefined1 local_68 [16];
  ulong local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = (message->m_arguments).d.d;
  pQVar1 = (message->m_arguments).d.ptr;
  local_58 = (message->m_arguments).d.size;
  if ((Data *)local_68._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_68._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         1;
    UNLOCK();
  }
  local_68._8_8_ = pQVar1;
  if (local_58 < 7) {
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      process2DObjSet((QTuioHandler *)&local_58);
    }
  }
  else {
    iVar3 = QVariant::typeId(pQVar1 + 1);
    if (iVar3 == 2) {
      iVar3 = QVariant::typeId(pQVar1 + 2);
      if (iVar3 == 2) {
        iVar3 = QVariant::typeId(pQVar1 + 3);
        if (iVar3 == 0x26) {
          iVar3 = QVariant::typeId(pQVar1 + 4);
          if (iVar3 == 0x26) {
            iVar3 = QVariant::typeId(pQVar1 + 5);
            if (iVar3 == 0x26) {
              iVar3 = QVariant::typeId(pQVar1 + 6);
              if (iVar3 == 0x26) {
                iVar3 = QVariant::typeId(pQVar1 + 7);
                if (iVar3 == 0x26) {
                  iVar3 = QVariant::typeId(pQVar1 + 8);
                  if (iVar3 == 0x26) {
                    iVar3 = QVariant::typeId(pQVar1 + 9);
                    if (iVar3 == 0x26) {
                      iVar3 = QVariant::typeId(pQVar1 + 10);
                      if (iVar3 == 0x26) {
                        local_80.stream._0_4_ = QVariant::toInt((bool *)(pQVar1 + 1));
                        t = QVariant::toInt((bool *)(pQVar1 + 2));
                        t_00 = (float)QVariant::toFloat((bool *)(pQVar1 + 3));
                        t_01 = (float)QVariant::toFloat((bool *)(pQVar1 + 4));
                        t_02 = (float)QVariant::toFloat((bool *)(pQVar1 + 5));
                        t_03 = (float)QVariant::toFloat((bool *)(pQVar1 + 6));
                        t_04 = (float)QVariant::toFloat((bool *)(pQVar1 + 7));
                        t_05 = (float)QVariant::toFloat((bool *)(pQVar1 + 8));
                        t_06 = (float)QVariant::toFloat((bool *)(pQVar1 + 9));
                        t_07 = (float)QVariant::toFloat((bool *)(pQVar1 + 10));
                        iVar4 = QMap<int,_QTuioToken>::find
                                          ((QMap<int,_QTuioToken> *)(this + 0x48),(int *)&local_80);
                        QMap<int,_QTuioToken>::detach((QMap<int,_QTuioToken> *)(this + 0x48));
                        lVar2 = *(long *)(this + 0x48);
                        lcTuioSet();
                        if (iVar4.i._M_node == (_Base_ptr)(lVar2 + 0x10)) {
                          if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value.
                                     _M_base._M_i & 1) != 0) {
                            process2DObjSet((QTuioHandler *)(ulong)t);
                          }
                        }
                        else {
                          if (((byte)lcTuioSet::category.field_2.bools.enabledDebug._q_value._M_base
                                     ._M_i & 1) != 0) {
                            QMessageLogger::debug();
                            pQVar5 = QDebug::operator<<((QDebug *)&local_50,
                                                        "Processing SET for token ");
                            pQVar5 = QDebug::operator<<(pQVar5,t);
                            pQVar5 = QDebug::operator<<(pQVar5,(int)local_80.stream);
                            pQVar5 = QDebug::operator<<(pQVar5," @ ");
                            pQVar5 = QDebug::operator<<(pQVar5,t_00);
                            pQVar5 = QDebug::operator<<(pQVar5,t_01);
                            pQVar5 = QDebug::operator<<(pQVar5," angle: ");
                            pQVar5 = QDebug::operator<<(pQVar5,t_02);
                            pQVar5 = QDebug::operator<<(pQVar5,"vel");
                            pQVar5 = QDebug::operator<<(pQVar5,t_03);
                            pQVar5 = QDebug::operator<<(pQVar5,t_04);
                            pQVar5 = QDebug::operator<<(pQVar5,t_05);
                            pQVar5 = QDebug::operator<<(pQVar5,"acc");
                            pQVar5 = QDebug::operator<<(pQVar5,t_06);
                            QDebug::operator<<(pQVar5,t_07);
                            QDebug::~QDebug((QDebug *)&local_50);
                          }
                          this_00 = (QTuioToken *)((long)iVar4.i._M_node + 0x24);
                          *(uint *)((long)iVar4.i._M_node + 0x28) = t;
                          QTuioToken::setX(this_00,t_00);
                          QTuioToken::setY(this_00,t_01);
                          *(float *)((long)iVar4.i._M_node + 0x34) = t_03;
                          *(float *)((long)iVar4.i._M_node + 0x38) = t_04;
                          *(float *)((long)iVar4.i._M_node + 0x3c) = t_06;
                          QTuioToken::setAngle(this_00,t_02);
                          *(float *)((long)iVar4.i._M_node + 0x44) = t_07;
                          *(float *)((long)iVar4.i._M_node + 0x48) = t_07;
                        }
                        goto LAB_0010b199;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lcTuioSet();
    if (((byte)lcTuioSet::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      QMessageLogger::warning();
      pQVar6 = (QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream);
      QVar7.m_data = (storage_type *)0x34;
      QVar7.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar6,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar6 = (QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream);
      if (pQVar6[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar6,' ');
        pQVar6 = (QTextStream *)CONCAT44(local_80.stream._4_4_,(int)local_80.stream);
      }
      *(int *)(pQVar6 + 0x28) = *(int *)(pQVar6 + 0x28) + 1;
      local_78.stream = (Stream *)0x0;
      QtPrivate::printSequentialContainer<QList<QVariant>>
                (local_70,(Stream *)&local_50,"QList",(QList<QVariant> *)local_68);
      QDebug::~QDebug((QDebug *)&local_50);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug(&local_78);
      QDebug::~QDebug(&local_80);
    }
  }
LAB_0010b199:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DObjSet(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();
    if (arguments.size() < 7) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with too few arguments: " << arguments.size();
        return;
    }

    if (QMetaType::Type(arguments.at(1).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(2).userType()) != QMetaType::Int ||
            QMetaType::Type(arguments.at(3).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(4).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(5).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(6).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(7).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(8).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(9).userType()) != QMetaType::Float ||
            QMetaType::Type(arguments.at(10).userType()) != QMetaType::Float) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set message with bad types: " << arguments;
        return;
    }

    int id = arguments.at(1).toInt();
    int classId = arguments.at(2).toInt();
    float x = arguments.at(3).toFloat();
    float y = arguments.at(4).toFloat();
    float angle = arguments.at(5).toFloat();
    float vx = arguments.at(6).toFloat();
    float vy = arguments.at(7).toFloat();
    float angularVelocity = arguments.at(8).toFloat();
    float acceleration = arguments.at(9).toFloat();
    float angularAcceleration = arguments.at(10).toFloat();

    QMap<int, QTuioToken>::Iterator it = m_activeTokens.find(id);
    if (it == m_activeTokens.end()) {
        qCWarning(lcTuioSet) << "Ignoring malformed TUIO set for nonexistent token " << classId;
        return;
    }

    qCDebug(lcTuioSet) << "Processing SET for token " << classId << id << " @ " << x << y << " angle: " << angle <<
                          "vel" << vx << vy << angularVelocity << "acc" << acceleration << angularAcceleration;
    QTuioToken &tok = *it;
    tok.setClassId(classId);
    tok.setX(x);
    tok.setY(y);
    tok.setVX(vx);
    tok.setVY(vy);
    tok.setAcceleration(acceleration);
    tok.setAngle(angle);
    tok.setAngularVelocity(angularAcceleration);
    tok.setAngularAcceleration(angularAcceleration);
}